

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_hole.c
# Opt level: O2

buffer_t * buffer_new(void)

{
  buffer_t *pbVar1;
  
  pbVar1 = (buffer_t *)malloc(0x28);
  if (pbVar1 != (buffer_t *)0x0) {
    pbVar1->fragment = (zip_uint8_t **)0x0;
    pbVar1->nfragments = 0;
    pbVar1->fragment_size = 0x2000;
    pbVar1->size = 0;
    pbVar1->offset = 0;
  }
  return pbVar1;
}

Assistant:

static buffer_t *
buffer_new(void) {
    buffer_t *buffer;

    if ((buffer = (buffer_t *)malloc(sizeof(*buffer))) == NULL) {
	return NULL;
    }

    buffer->fragment = NULL;
    buffer->nfragments = 0;
    buffer->fragment_size = FRAGMENT_SIZE;
    buffer->size = 0;
    buffer->offset = 0;

    return buffer;
}